

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O1

void __thiscall QFSFileEngine::QFSFileEngine(QFSFileEngine *this,QString *file)

{
  QAbstractFileEnginePrivate *pQVar1;
  Data *pDVar2;
  QArrayData *data;
  char *pcVar3;
  QAbstractFileEngine *pQVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  QFSFileEnginePrivate *this_00;
  long in_FS_OFFSET;
  QFileSystemEntry local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine =
       (_func_int **)&PTR__QFSFileEngine_006a7a60;
  this_00 = (QFSFileEnginePrivate *)operator_new(200);
  QFSFileEnginePrivate::QFSFileEnginePrivate(this_00,&this->super_QAbstractFileEngine);
  QAbstractFileEngine::QAbstractFileEngine
            (&this->super_QAbstractFileEngine,(QAbstractFileEnginePrivate *)this_00);
  (this->super_QAbstractFileEngine)._vptr_QAbstractFileEngine =
       (_func_int **)&PTR__QFSFileEngine_006a7a60;
  pQVar1 = (this->super_QAbstractFileEngine).d_ptr.d;
  QFileSystemEntry::QFileSystemEntry(&local_68,file);
  pQVar5 = (QArrayData *)pQVar1[1]._vptr_QAbstractFileEnginePrivate;
  pcVar6 = *(char16_t **)&pQVar1[1].fileError;
  pQVar1[1]._vptr_QAbstractFileEnginePrivate = (_func_int **)local_68.m_filePath.d.d;
  *(char16_t **)&pQVar1[1].fileError = local_68.m_filePath.d.ptr;
  pDVar2 = pQVar1[1].errorString.d.d;
  pQVar1[1].errorString.d.d = (Data *)local_68.m_filePath.d.size;
  data = (QArrayData *)pQVar1[1].errorString.d.ptr;
  pcVar3 = (char *)pQVar1[1].errorString.d.size;
  pQVar1[1].errorString.d.ptr = (char16_t *)local_68.m_nativeFilePath.d.d;
  pQVar1[1].errorString.d.size = (qsizetype)local_68.m_nativeFilePath.d.ptr;
  pQVar4 = pQVar1[1].q_ptr;
  pQVar1[1].q_ptr = (QAbstractFileEngine *)local_68.m_nativeFilePath.d.size;
  *(qint16 *)((long)&pQVar1[2]._vptr_QAbstractFileEnginePrivate + 4) = local_68.m_lastDotInFileName;
  *(undefined4 *)&pQVar1[2]._vptr_QAbstractFileEnginePrivate = local_68._48_4_;
  local_68.m_filePath.d.d = (Data *)pQVar5;
  local_68.m_filePath.d.ptr = pcVar6;
  local_68.m_filePath.d.size = (qsizetype)pDVar2;
  local_68.m_nativeFilePath.d.d = (Data *)data;
  local_68.m_nativeFilePath.d.ptr = pcVar3;
  local_68.m_nativeFilePath.d.size = (qsizetype)pQVar4;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
  if (&(local_68.m_filePath.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_68.m_filePath.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_68.m_filePath.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFSFileEngine::QFSFileEngine(const QString &file)
    : QAbstractFileEngine(*new QFSFileEnginePrivate(this))
{
    Q_D(QFSFileEngine);
    d->fileEntry = QFileSystemEntry(file);
}